

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.cpp
# Opt level: O1

bool32 rw::Image::registerFileFormat(char *ext,fileRead read,fileWrite write)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  long lVar5;
  
  iVar1 = *(int *)(engine + 0x100 + (long)imageModuleOffset);
  if (iVar1 < 10) {
    lVar5 = engine + imageModuleOffset;
    pcVar3 = strdup_LOC(ext,0x30000,
                        "file: /workspace/llm4binary/github/license_all_cmakelists_1510/AGraber[P]librw/src/image.cpp line: 1030"
                       );
    iVar2 = *(int *)(lVar5 + 0x100);
    lVar4 = (long)iVar2;
    *(char **)(lVar5 + 0x10 + lVar4 * 0x18) = pcVar3;
    *(fileRead *)(lVar5 + 0x18 + lVar4 * 0x18) = read;
    *(fileWrite *)(lVar5 + 0x20 + lVar4 * 0x18) = write;
    *(int *)(lVar5 + 0x100) = iVar2 + 1;
  }
  return (uint)(iVar1 < 10);
}

Assistant:

bool32
Image::registerFileFormat(const char *ext, fileRead read, fileWrite write)
{
	ImageGlobals *g = PLUGINOFFSET(ImageGlobals, engine, imageModuleOffset);
	if(g->numFileFormats >= (int)nelem(g->fileFormats))
		return 0;
	g->fileFormats[g->numFileFormats].extension = rwStrdup(ext, MEMDUR_EVENT);
	g->fileFormats[g->numFileFormats].read = read;
	g->fileFormats[g->numFileFormats].write = write;
	g->numFileFormats++;
	return 1;
}